

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLexer.cpp
# Opt level: O2

string * __thiscall
json::JsonLexer::readFraction_abi_cxx11_
          (string *__return_storage_ptr__,JsonLexer *this,istream *input)

{
  long *plVar1;
  runtime_error *this_00;
  istream *input_00;
  char c;
  string local_38;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,".",(allocator *)&local_38);
  std::istream::get();
  plVar1 = (long *)std::istream::get((char *)this);
  if (((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) == 0) &&
     ((int)c - 0x30U < 10)) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    readDigits_abi_cxx11_(&local_38,this,input_00);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_38);
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"After a decimal point there must be at least one digit");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string JsonLexer::readFraction(std::istream &input)
    {
        std::string fraction = ".";
        char c;
        input.get(); // This will return a decimal point.

        if (!(input.get(c)) || !isdigit(c))
            throw std::runtime_error("After a decimal point there must be at least one digit");

        fraction += c;
        fraction += readDigits(input);
        return fraction;
    }